

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cc
# Opt level: O0

TimeInfo * __thiscall
absl::TimeZone::At(TimeInfo *__return_storage_ptr__,TimeZone *this,CivilSecond ct)

{
  Time TVar1;
  TimeInfo *ti;
  undefined4 uStack_74;
  undefined4 uStack_64;
  undefined4 uStack_54;
  undefined1 local_50 [8];
  civil_lookup cl;
  civil_second cs;
  TimeZone *this_local;
  CivilSecond ct_local;
  
  ct_local.f_.y = ct.f_._8_8_;
  this_local = (TimeZone *)ct.f_.y;
  time_internal::cctz::detail::civil_time<absl::time_internal::cctz::detail::second_tag>::
  civil_time<absl::time_internal::second_tag>
            ((civil_time<absl::time_internal::cctz::detail::second_tag> *)&cl.post,
             (civil_time<absl::time_internal::second_tag> *)&this_local,
             (preserves_data<absl::time_internal::cctz::detail::second_tag,_absl::time_internal::second_tag>
              *)0x0);
  time_internal::cctz::time_zone::lookup
            ((civil_lookup *)local_50,(time_zone *)this,(civil_second *)&cl.post);
  TimeInfo::TimeInfo(__return_storage_ptr__);
  if (local_50._0_4_ == UNIQUE) {
    __return_storage_ptr__->kind = UNIQUE;
  }
  else if (local_50._0_4_ == SKIPPED) {
    __return_storage_ptr__->kind = SKIPPED;
  }
  else if (local_50._0_4_ == REPEATED) {
    __return_storage_ptr__->kind = REPEATED;
  }
  TVar1 = anon_unknown_8::MakeTimeWithOverflow
                    ((time_point<cctz::seconds> *)&cl,(civil_second *)&cl.post,(time_zone *)this,
                     (bool *)0x0);
  (__return_storage_ptr__->pre).rep_.rep_hi_ = TVar1.rep_.rep_hi_;
  *(ulong *)&(__return_storage_ptr__->pre).rep_.rep_lo_ = CONCAT44(uStack_54,TVar1.rep_.rep_lo_);
  TVar1 = anon_unknown_8::MakeTimeWithOverflow
                    (&cl.pre,(civil_second *)&cl.post,(time_zone *)this,(bool *)0x0);
  (__return_storage_ptr__->trans).rep_.rep_hi_ = TVar1.rep_.rep_hi_;
  *(ulong *)&(__return_storage_ptr__->trans).rep_.rep_lo_ = CONCAT44(uStack_64,TVar1.rep_.rep_lo_);
  TVar1 = anon_unknown_8::MakeTimeWithOverflow
                    (&cl.trans,(civil_second *)&cl.post,(time_zone *)this,(bool *)0x0);
  (__return_storage_ptr__->post).rep_.rep_hi_ = TVar1.rep_.rep_hi_;
  *(ulong *)&(__return_storage_ptr__->post).rep_.rep_lo_ = CONCAT44(uStack_74,TVar1.rep_.rep_lo_);
  return __return_storage_ptr__;
}

Assistant:

absl::TimeZone::TimeInfo TimeZone::At(CivilSecond ct) const {
  const cctz::civil_second cs(ct);
  const auto cl = cz_.lookup(cs);

  TimeZone::TimeInfo ti;
  switch (cl.kind) {
    case cctz::time_zone::civil_lookup::UNIQUE:
      ti.kind = TimeZone::TimeInfo::UNIQUE;
      break;
    case cctz::time_zone::civil_lookup::SKIPPED:
      ti.kind = TimeZone::TimeInfo::SKIPPED;
      break;
    case cctz::time_zone::civil_lookup::REPEATED:
      ti.kind = TimeZone::TimeInfo::REPEATED;
      break;
  }
  ti.pre = MakeTimeWithOverflow(cl.pre, cs, cz_);
  ti.trans = MakeTimeWithOverflow(cl.trans, cs, cz_);
  ti.post = MakeTimeWithOverflow(cl.post, cs, cz_);
  return ti;
}